

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ut.hpp
# Opt level: O1

void __thiscall
boost::ext::ut::v1_1_8::reporter<boost::ext::ut::v1_1_8::printer>::on
          (reporter<boost::ext::ut::v1_1_8::printer> *this)

{
  undefined1 *puVar1;
  ostream *poVar2;
  char local_50;
  undefined7 uStack_4f;
  long local_48;
  long local_40 [2];
  
  if (on::once) {
    on::once = false;
    if ((this->asserts_).fail == 0 && (this->tests_).fail == 0) {
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,(this->printer_).colors_.pass._M_str,
                          (this->printer_).colors_.pass._M_len);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"All tests passed",0x10);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar2,(this->printer_).colors_.none._M_str,
                          (this->printer_).colors_.none._M_len);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2," (",2);
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2," asserts in ",0xc);
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2," tests)\n",8);
      if ((this->tests_).skip != 0) {
        poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2," tests skipped\n",0xf);
      }
      std::ostream::flush();
      return;
    }
    puVar1 = &(this->printer_).field_0x40;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)puVar1,
               "\n===============================================================================\n"
               ,0x51);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar1,"tests:   ",9);
    std::ostream::_M_insert<unsigned_long>((ulong)puVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar1," | ",3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)puVar1,(this->printer_).colors_.fail._M_str,
               (this->printer_).colors_.fail._M_len);
    std::ostream::_M_insert<unsigned_long>((ulong)puVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar1," failed",7);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)puVar1,(this->printer_).colors_.none._M_str,
               (this->printer_).colors_.none._M_len);
    local_50 = '\n';
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar1,&local_50,1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar1,"asserts: ",9);
    std::ostream::_M_insert<unsigned_long>((ulong)puVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar1," | ",3);
    std::ostream::_M_insert<unsigned_long>((ulong)puVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar1," passed",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar1," | ",3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)puVar1,(this->printer_).colors_.fail._M_str,
               (this->printer_).colors_.fail._M_len);
    std::ostream::_M_insert<unsigned_long>((ulong)puVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar1," failed",7);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)puVar1,(this->printer_).colors_.none._M_str,
               (this->printer_).colors_.none._M_len);
    local_50 = '\n';
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar1,&local_50,1);
    std::__cxx11::stringbuf::str();
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(char *)CONCAT71(uStack_4f,local_50),local_48);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    if ((long *)CONCAT71(uStack_4f,local_50) != local_40) {
      operator_delete((long *)CONCAT71(uStack_4f,local_50),local_40[0] + 1);
    }
  }
  return;
}

Assistant:

auto on(events::summary) -> void {
      if (static auto once = true; once) {
        once = false;
        if (tests_.fail or asserts_.fail) {
          printer_
              << "\n========================================================"
                 "=======================\n"
              << "tests:   " << (tests_.pass + tests_.fail) << " | "
              << printer_.colors().fail << tests_.fail << " failed"
              << printer_.colors().none << '\n'
              << "asserts: " << (asserts_.pass + asserts_.fail) << " | "
              << asserts_.pass << " passed"
              << " | " << printer_.colors().fail << asserts_.fail << " failed"
              << printer_.colors().none << '\n';
          std::cerr << printer_.str() << std::endl;
        } else {
          std::cout << printer_.colors().pass << "All tests passed"
                    << printer_.colors().none << " (" << asserts_.pass
                    << " asserts in " << tests_.pass << " tests)\n";

          if (tests_.skip) {
            std::cout << tests_.skip << " tests skipped\n";
          }

          std::cout.flush();
        }
      }
    }